

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::tfdt::parse(tfdt *this,char *ptr)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  
  box::parse((box *)this,ptr);
  uVar3 = (ulong)((uint)(this->super_full_box).super_box.has_uuid_ * 0x10 +
                 (uint)(this->super_full_box).super_box.is_large_ * 8);
  uVar2 = *(uint *)(ptr + uVar3 + 8);
  (this->super_full_box).magic_conf_ =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  cVar1 = ptr[uVar3 + 8];
  (this->super_full_box).super_box.field_0x62 = cVar1;
  uVar2 = *(uint *)(ptr + uVar3 + 8);
  *(uint *)&(this->super_full_box).super_box.field_0x64 =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8;
  if (cVar1 == '\0') {
    uVar2 = *(uint *)(ptr + 0xc);
    uVar3 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
    ;
  }
  else {
    uVar3 = *(ulong *)(ptr + 0xc);
    uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  }
  this->base_media_decode_time_ = uVar3;
  return;
}

Assistant:

void tfdt::parse(const char* ptr)
	{
		full_box::parse(ptr);
		base_media_decode_time_ = version_ ? \
			fmp4_read_uint64((char *)(ptr + 12)) : \
			fmp4_read_uint32((char *)(ptr + 12));

	}